

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
json_sax_dom_parser<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::start_array(json_sax_dom_parser<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this,size_t len)

{
  bool bVar1;
  size_t sVar2;
  reference ppbVar3;
  size_type sVar4;
  out_of_range *__return_storage_ptr__;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  value_t local_21;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_20;
  size_t local_18;
  size_t len_local;
  json_sax_dom_parser<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  local_21 = array;
  local_18 = len;
  len_local = (size_t)this;
  local_20 = handle_value<nlohmann::detail::value_t>(this,&local_21);
  std::
  vector<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  ::push_back(&this->ref_stack,&local_20);
  sVar2 = local_18;
  bVar1 = false;
  if (local_18 != 0xffffffffffffffff) {
    ppbVar3 = std::
              vector<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
              ::back(&this->ref_stack);
    sVar4 = basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::max_size(*ppbVar3);
    bVar1 = sVar4 < sVar2;
  }
  if (!bVar1) {
    return true;
  }
  __return_storage_ptr__ = (out_of_range *)__cxa_allocate_exception(0x20);
  std::__cxx11::to_string(&local_68,local_18);
  std::operator+(&local_48,"excessive array size: ",&local_68);
  out_of_range::create(__return_storage_ptr__,0x198,&local_48);
  __cxa_throw(__return_storage_ptr__,&out_of_range::typeinfo,out_of_range::~out_of_range);
}

Assistant:

bool start_array(std::size_t len)
    {
        ref_stack.push_back(handle_value(BasicJsonType::value_t::array));

        if (JSON_UNLIKELY(len != std::size_t(-1) and len > ref_stack.back()->max_size()))
        {
            JSON_THROW(out_of_range::create(408,
                                            "excessive array size: " + std::to_string(len)));
        }

        return true;
    }